

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_dbp_encoder.hpp
# Opt level: O2

void __thiscall duckdb::DbpEncoder::FinishWrite(DbpEncoder *this,WriteStream *writer)

{
  InternalException *this_00;
  allocator local_39;
  string local_38 [32];
  
  if (this->count + this->block_count != this->total_value_count) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              (local_38,"value count mismatch when writing DELTA_BINARY_PACKED",&local_39);
    duckdb::InternalException::InternalException(this_00,local_38);
    __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  }
  if (this->block_count != 0) {
    WriteBlock(this,writer);
    return;
  }
  return;
}

Assistant:

void FinishWrite(WriteStream &writer) {
		if (count + block_count != total_value_count) {
			throw InternalException("value count mismatch when writing DELTA_BINARY_PACKED");
		}
		if (block_count != 0) {
			WriteBlock(writer);
		}
	}